

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false> *this,uint newSize,
          ExpiredFunctionAddressList *val)

{
  ExpiredFunctionAddressList *pEVar1;
  uint uVar2;
  ExpiredFunctionAddressList *pEVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  
  pEVar3 = this->data;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  uVar4 = *(undefined4 *)((long)&val->data + 4);
  uVar5 = val->count;
  uVar6 = *(undefined4 *)&val->field_0xc;
  pEVar1 = this->data + uVar2;
  *(undefined4 *)&pEVar1->data = *(undefined4 *)&val->data;
  *(undefined4 *)((long)&pEVar1->data + 4) = uVar4;
  pEVar1->count = uVar5;
  *(undefined4 *)&pEVar1->field_0xc = uVar6;
  if (pEVar3 != (ExpiredFunctionAddressList *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}